

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O2

void connection_destroy(CONNECTION_HANDLE connection)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (connection != (CONNECTION_HANDLE)0x0) {
    if ((connection->field_0xe0 & 1) != 0) {
      connection_close(connection,(char *)0x0,(char *)0x0,(AMQP_VALUE)0x0);
    }
    amqp_frame_codec_destroy(connection->amqp_frame_codec);
    frame_codec_destroy(connection->frame_codec);
    tickcounter_destroy(connection->tick_counter);
    if (connection->properties != (AMQP_VALUE)0x0) {
      amqpvalue_destroy(connection->properties);
    }
    free(connection->host_name);
    free(connection->container_id);
    free(connection);
    return;
  }
  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
               ,"connection_destroy",0x518,1,"NULL connection");
    return;
  }
  return;
}

Assistant:

void connection_destroy(CONNECTION_HANDLE connection)
{
    /* Codes_S_R_S_CONNECTION_01_079: [If handle is NULL, connection_destroy shall do nothing.] */
    if (connection == NULL)
    {
        LogError("NULL connection");
    }
    else
    {
        /* Codes_S_R_S_CONNECTION_01_073: [connection_destroy shall free all resources associated with a connection.] */
        if (connection->is_underlying_io_open)
        {
            (void)connection_close(connection, NULL, NULL, NULL);
        }

        amqp_frame_codec_destroy(connection->amqp_frame_codec);
        frame_codec_destroy(connection->frame_codec);
        tickcounter_destroy(connection->tick_counter);
        if (connection->properties != NULL)
        {
            amqpvalue_destroy(connection->properties);
        }

        free(connection->host_name);
        free(connection->container_id);

        /* Codes_S_R_S_CONNECTION_01_074: [connection_destroy shall close the socket connection.] */
        free(connection);
    }
}